

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void float_invalid_op_div(CPUPPCState_conflict *env,_Bool set_fprc,uintptr_t retaddr,int classes)

{
  int classes_local;
  uintptr_t retaddr_local;
  _Bool set_fprc_local;
  CPUPPCState_conflict *env_local;
  
  if ((classes & 0xffffffbfU) == 8) {
    float_invalid_op_vxidi(env,set_fprc,retaddr);
  }
  else if ((classes & 0xffffffbfU) == 2) {
    float_invalid_op_vxzdz(env,set_fprc,retaddr);
  }
  else if ((classes & 0x20U) != 0) {
    float_invalid_op_vxsnan(env,retaddr);
  }
  return;
}

Assistant:

static void float_invalid_op_div(CPUPPCState *env, bool set_fprc,
                                 uintptr_t retaddr, int classes)
{
    classes &= ~is_neg;
    if (classes == is_inf) {
        /* Division of infinity by infinity */
        float_invalid_op_vxidi(env, set_fprc, retaddr);
    } else if (classes == is_zero) {
        /* Division of zero by zero */
        float_invalid_op_vxzdz(env, set_fprc, retaddr);
    } else if (classes & is_snan) {
        float_invalid_op_vxsnan(env, retaddr);
    }
}